

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9If(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  If_DsdMan_t *pIVar7;
  Gia_Man_t *pGVar8;
  float (*pafVar9) [33];
  code *pcVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  ulong uStack_330;
  If_Par_t Pars;
  char Buffer [200];
  char LutSize [200];
  
  Gia_ManSetIfParsDefault(&Pars);
  Pars.pLutLib = (If_LibLut_t *)pAbc->pLibLut;
  if (Pars.pLutLib == (If_LibLut_t *)0x0) {
    Abc_Print(-1,"LUT library is not given. Using default LUT library.\n");
    Pars.pLutLib = If_LibLutSetSimple(6);
    pAbc->pLibLut = Pars.pLutLib;
  }
  Extra_UtilGetoptReset();
  iVar11 = 1;
LAB_00250cc4:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFAGRDEWSTXYqalepmrsdbgxyofuijkztncvwh");
  iVar5 = globalUtilOptind;
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nAreaIters = iVar1;
    goto LAB_00250ea1;
  case 0x42:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x55:
  case 0x56:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    goto switchD_00250ce5_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-C\" should be followed by a positive integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nCutsMax = iVar1;
    goto LAB_00250ea1;
  case 0x44:
    if (globalUtilOptind < argc) {
      dVar19 = atof(argv[globalUtilOptind]);
      Pars.DelayTarget = (float)dVar19;
      globalUtilOptind = iVar5 + 1;
      if (Pars.DelayTarget <= 0.0) goto LAB_0025119e;
      goto LAB_00250cc4;
    }
    pcVar12 = "Command line switch \"-D\" should be followed by a floating point number.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      dVar19 = atof(argv[globalUtilOptind]);
      Pars.Epsilon = (float)dVar19;
      globalUtilOptind = iVar5 + 1;
      if ((Pars.Epsilon < 0.0) || (1.0 < Pars.Epsilon)) goto switchD_00250ce5_caseD_42;
      goto LAB_00250cc4;
    }
    pcVar12 = "Command line switch \"-E\" should be followed by a floating point number.\n";
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nFlowIters = iVar1;
    goto LAB_00250ea1;
  case 0x47:
    if (globalUtilOptind < argc) {
      Pars.nGateSize = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar5 + 1;
      if (Pars.nGateSize < 2) goto switchD_00250ce5_caseD_42;
      goto LAB_00250cc4;
    }
    pcVar12 = 
    "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n";
    break;
  case 0x4b:
    if (globalUtilOptind < argc) {
      Pars.nLutSize = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar5 + 1;
      if (Pars.nLutSize < 0) goto switchD_00250ce5_caseD_42;
      Pars.pLutLib = (If_LibLut_t *)0x0;
      goto LAB_00250cc4;
    }
    pcVar12 = "Command line switch \"-K\" should be followed by a positive integer.\n";
    break;
  case 0x52:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-R\" should be followed by a floating point number.\n";
      iVar11 = 0;
      iVar5 = 1;
      goto LAB_002516bc;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nRelaxRatio = iVar1;
LAB_00250ea1:
    bVar18 = iVar1 < 0;
LAB_00250eab:
    globalUtilOptind = iVar5 + 1;
    if (bVar18) goto switchD_00250ce5_caseD_42;
    goto LAB_00250cc4;
  case 0x53:
    if (globalUtilOptind < argc) {
      Pars.pLutStruct = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      sVar6 = strlen(Pars.pLutStruct);
      if ((sVar6 & 0xfffffffffffffffe) == 2) goto LAB_00250cc4;
      pcVar12 = 
      "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
      ;
    }
    else {
      pcVar12 = "Command line switch \"-S\" should be followed by string.\n";
    }
    break;
  case 0x54:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n";
      break;
    }
    Pars.nStructType = atoi(argv[globalUtilOptind]);
    bVar17 = (uint)Pars.nStructType < 2;
    bVar18 = Pars.nStructType == 2;
LAB_00251083:
    globalUtilOptind = iVar5 + 1;
    if (!bVar17 && !bVar18) {
switchD_00250ce5_caseD_42:
LAB_0025119e:
      if ((Pars.DelayTarget != -1.0) || (NAN(Pars.DelayTarget))) {
        sprintf(Buffer,"%.2f",(double)Pars.DelayTarget);
      }
      else {
        builtin_strncpy(Buffer + 8,"sible",6);
        builtin_strncpy(Buffer,"best pos",8);
      }
      if (Pars.nLutSize == -1) {
        builtin_strncpy(LutSize,"library",8);
      }
      else {
        sprintf(LutSize,"%d");
      }
      Abc_Print(-2,
                "usage: &if [-KCFAGRTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyofuijkztnchvw]\n")
      ;
      Abc_Print(-2,"\t           performs FPGA technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n",0x21,
                LutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n",
                (ulong)(uint)Pars.nCutsMax);
      Abc_Print(-2,
                "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)Pars.nFlowIters);
      Abc_Print(-2,
                "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)Pars.nAreaIters);
      Abc_Print(-2,"\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n"
                ,(ulong)(uint)Pars.nGateSize);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)Pars.nRelaxRatio);
      Abc_Print(-2,"\t-T num   : the type of LUT structures [default = any]\n",
                (ulong)(uint)Pars.nStructType);
      Abc_Print(-2,"\t-X num   : delay of AND-gate in LUT library units [default = %d]\n",
                (ulong)(uint)Pars.nAndDelay);
      Abc_Print(-2,"\t-Y num   : area of AND-gate in LUT library units [default = %d]\n",
                (ulong)(uint)Pars.nAndArea);
      Abc_Print(-2,"\t-D float : sets the delay constraint for the mapping [default = %s]\n",Buffer)
      ;
      Abc_Print(-2,"\t-E float : sets epsilon used for tie-breaking [default = %f]\n",
                (double)Pars.Epsilon);
      Abc_Print(-2,"\t-W float : sets wire delay between adjects LUTs [default = %f]\n",
                (double)Pars.WireDelay);
      pcVar12 = "not used";
      if (Pars.pLutStruct != (char *)0x0) {
        pcVar12 = Pars.pLutStruct;
      }
      Abc_Print(-2,"\t-S str   : string representing the LUT structure [default = %s]\n",pcVar12);
      pcVar16 = "yes";
      pcVar12 = "yes";
      if (Pars.fPreprocess == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-q       : toggles preprocessing using several starting points [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fArea == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fExpRed == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-r       : enables expansion/reduction of the best cuts [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fLut6Filter == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-l       : toggle restricting the type of 6-input lookup tables [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (Pars.fEdge == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-e       : uses edge-based cut selection heuristics [default = %s]\n",pcVar12)
      ;
      pcVar12 = "yes";
      if (Pars.fPower == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-p       : uses power-aware cut selection heuristics [default = %s]\n",pcVar12
               );
      pcVar12 = "yes";
      if (Pars.fCutMin == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (Pars.fDelayOptLut == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fUse34Spec == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-d       : toggles deriving specialized matching step [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseBat == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-b       : toggles the use of one special feature [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fDelayOpt == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-g       : toggles delay optimization by SOP balancing [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fDsdBalance == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-x       : toggles delay optimization by DSD balancing [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fUserRecLib == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-y       : toggles delay optimization with recorded library [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseBuffs == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (Pars.fEnableCheck75 == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-f       : toggles enabling additional check [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fEnableCheck75u == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-u       : toggles enabling additional check [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseCofVars == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-i       : toggles using cofactoring variables [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseAndVars == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-j       : toggles using AND bi-decomposition [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseDsdTune == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (Pars.fDeriveLuts == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-z       : toggles deriving LUTs when mapping into LUT structures [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (Pars.fDoAverage == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseDsd == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-n       : toggles computing DSDs of the cut functions [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fUseTtPerm == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-c       : toggles computing truth tables in a new way [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (Pars.fHashMapping == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-h       : toggles rehashing AIG after mapping [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar12);
      if (Pars.fVerboseTrace == 0) {
        pcVar16 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles printing delay trace [default = %s]\n",pcVar16);
      return 1;
    }
    goto LAB_00250cc4;
  case 0x57:
    if (globalUtilOptind < argc) {
      dVar19 = atof(argv[globalUtilOptind]);
      Pars.WireDelay = (float)dVar19;
      bVar18 = Pars.WireDelay == 0.0;
      bVar17 = 0.0 < Pars.WireDelay;
      goto LAB_00251083;
    }
    pcVar12 = "Command line switch \"-W\" should be followed by a floating point number.\n";
    break;
  case 0x58:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n";
      break;
    }
    Pars.nAndDelay = atoi(argv[globalUtilOptind]);
    bVar18 = Pars.nAndArea < 0;
    goto LAB_00250eab;
  case 0x59:
    if (globalUtilOptind < argc) {
      Pars.nAndArea = atoi(argv[globalUtilOptind]);
      bVar18 = Pars.nAndDelay < 0;
      goto LAB_00250eab;
    }
    pcVar12 = "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n";
    break;
  case 0x61:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_00250cc4;
  case 0x62:
    Pars.fUseBat = Pars.fUseBat ^ 1;
    goto LAB_00250cc4;
  case 99:
    Pars.fUseTtPerm = Pars.fUseTtPerm ^ 1;
    goto LAB_00250cc4;
  case 100:
    Pars.fUse34Spec = Pars.fUse34Spec ^ 1;
    goto LAB_00250cc4;
  case 0x65:
    Pars.fEdge = Pars.fEdge ^ 1;
    goto LAB_00250cc4;
  case 0x66:
    Pars.fEnableCheck75 = Pars.fEnableCheck75 ^ 1;
    goto LAB_00250cc4;
  case 0x67:
    Pars.fDelayOpt = Pars.fDelayOpt ^ 1;
    goto LAB_00250cc4;
  case 0x68:
    Pars.fHashMapping = Pars.fHashMapping ^ 1;
    goto LAB_00250cc4;
  case 0x69:
    Pars.fUseCofVars = Pars.fUseCofVars ^ 1;
    goto LAB_00250cc4;
  case 0x6a:
    Pars.fUseAndVars = Pars.fUseAndVars ^ 1;
    goto LAB_00250cc4;
  case 0x6b:
    Pars.fUseDsdTune = Pars.fUseDsdTune ^ 1;
    goto LAB_00250cc4;
  case 0x6c:
    Pars.fLut6Filter = Pars.fLut6Filter ^ 1;
    goto LAB_00250cc4;
  case 0x6d:
    Pars.fCutMin = Pars.fCutMin ^ 1;
    goto LAB_00250cc4;
  case 0x6e:
    Pars.fUseDsd = Pars.fUseDsd ^ 1;
    goto LAB_00250cc4;
  case 0x6f:
    Pars.fUseBuffs = Pars.fUseBuffs ^ 1;
    goto LAB_00250cc4;
  case 0x70:
    Pars.fPower = Pars.fPower ^ 1;
    goto LAB_00250cc4;
  case 0x71:
    Pars.fPreprocess = Pars.fPreprocess ^ 1;
    goto LAB_00250cc4;
  case 0x72:
    Pars.fExpRed = Pars.fExpRed ^ 1;
    goto LAB_00250cc4;
  case 0x73:
    Pars.fDelayOptLut = Pars.fDelayOptLut ^ 1;
    goto LAB_00250cc4;
  case 0x74:
    Pars.fDoAverage = Pars.fDoAverage ^ 1;
    goto LAB_00250cc4;
  case 0x75:
    Pars.fEnableCheck75u = Pars.fEnableCheck75u ^ 1;
    goto LAB_00250cc4;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_00250cc4;
  case 0x77:
    Pars.fVerboseTrace = Pars.fVerboseTrace ^ 1;
    goto LAB_00250cc4;
  case 0x78:
    Pars.fDsdBalance = Pars.fDsdBalance ^ 1;
    goto LAB_00250cc4;
  case 0x79:
    Pars.fUserRecLib = Pars.fUserRecLib ^ 1;
    goto LAB_00250cc4;
  case 0x7a:
    Pars.fDeriveLuts = Pars.fDeriveLuts ^ 1;
    goto LAB_00250cc4;
  default:
    if (iVar1 == -1) {
      pGVar8 = pAbc->pGia;
      if (pGVar8 == (Gia_Man_t *)0x0) {
        pcVar12 = Abc_FrameReadFlag("silentmode");
        if (pcVar12 != (char *)0x0) {
          return 0;
        }
        pcVar12 = "Empty GIA network.\n";
        iVar11 = 0;
        goto LAB_002516ba;
      }
      if (pGVar8->nBufs != 0) {
        pcVar12 = "This command does not work with barrier buffers.\n";
        goto LAB_002516ba;
      }
      if (pGVar8->vMapping != (Vec_Int_t *)0x0) {
        pcVar12 = "Current AIG has mapping. Run \"&st\".\n";
        goto LAB_002516ba;
      }
      if (Pars.nLutSize == -1) {
        if (Pars.pLutLib == (If_LibLut_t *)0x0) {
          pcVar12 = "The LUT library is not given.\n";
          goto LAB_002516ba;
        }
        Pars.nLutSize = (Pars.pLutLib)->LutMax;
      }
      uStack_330 = (ulong)(uint)Pars.nLutSize;
      if (Pars.nLutSize - 0x21U < 0xffffffe1) {
        pcVar12 = "Incorrect LUT size (%d).\n";
        goto LAB_002516f5;
      }
      if (Pars.nCutsMax - 0x1000U < 0xfffff001) {
        pcVar12 = "Incorrect number of cuts.\n";
        goto LAB_002516ba;
      }
      if (pGVar8->pSibls != (int *)0x0) {
        Pars.fExpRed = 0;
      }
      if (Pars.fUseBat != 0) {
        if (Pars.nLutSize - 7U < 0xfffffffd) {
          pcVar12 = "This feature only works for {4,5,6}-LUTs.\n";
          goto LAB_002516ba;
        }
        Pars.fCutMin = 1;
      }
      if (1 < (int)((Pars.fUseDsdTune + Pars.fEnableCheck75 + Pars.fUseCofVars + Pars.fEnableCheck07
                     + Pars.fEnableCheck75u + 1) - (uint)(Pars.pLutStruct == (char *)0x0))) {
        pcVar12 = "Only one additional check can be performed at the same time.\n";
        goto LAB_002516ba;
      }
      if (Pars.fEnableCheck07 != 0) {
        if (Pars.nLutSize - 8U < 0xfffffffe) {
          pcVar12 = "This feature only works for {6,7}-LUTs.\n";
          goto LAB_002516ba;
        }
        Pars.pFuncCell = If_CutPerformCheck07;
        Pars.fCutMin = 1;
      }
      if (Pars.fUseCofVars != 0) {
        if ((Pars.nLutSize & 1U) == 0) {
          pcVar12 = "This feature only works for odd-sized LUTs.\n";
          goto LAB_002516ba;
        }
        Pars.fCutMin = 1;
      }
      if (Pars.fUseAndVars != 0) {
        Pars.fCutMin = 1;
      }
      if (Pars.fUseDsdTune != 0) {
        pIVar7 = (If_DsdMan_t *)Abc_FrameReadManDsd();
        iVar5 = Pars.nLutSize;
        if (pIVar7 == (If_DsdMan_t *)0x0) {
          pcVar12 = "DSD manager is not available.\n";
          goto LAB_002516ba;
        }
        iVar2 = If_DsdManVarNum(pIVar7);
        iVar1 = Pars.nLutSize;
        if (iVar2 < iVar5) {
          uVar3 = If_DsdManVarNum(pIVar7);
          Abc_Print(-1,
                    "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n",
                    (ulong)(uint)iVar1,(ulong)uVar3);
          return 1;
        }
        if ((Pars.fDeriveLuts != 0) &&
           (pcVar12 = If_DsdManGetCellStr(pIVar7), pcVar12 == (char *)0x0)) {
          pcVar12 = "DSD manager is not matched with any particular cell.\n";
          goto LAB_002516ba;
        }
        Pars.fCutMin = 1;
        Pars.fUseDsd = Pars.fCutMin;
        If_DsdManSetNewAsUseless(pIVar7);
      }
      if (Pars.fEnableCheck75 != 0 || Pars.fEnableCheck75u != 0) {
        if (Pars.fEnableCheck75 != 0 && Pars.fEnableCheck75u != 0) {
          pcVar12 = "Switches -f and -u are not compatible.\n";
          goto LAB_002516ba;
        }
        if (Pars.nLutSize - 9U < 0xfffffffc) {
          pcVar12 = "This feature only works for {6,7,8}-LUTs.\n";
          goto LAB_002516ba;
        }
        Pars.pFuncCell = If_CutPerformCheck75;
        Pars.fCutMin = 1;
      }
      if (Pars.pLutStruct != (char *)0x0) {
        if (Pars.fDsdBalance != 0) {
          pcVar12 = "Incompatible options (-S and -x).\n";
          goto LAB_002516ba;
        }
        if (Pars.nLutSize - 0x11U < 0xfffffff5) {
          pcVar12 = "This feature only works for [6;16]-LUTs.\n";
          goto LAB_002516ba;
        }
        if (Pars.fDelayOptLut == 0) {
          pcVar10 = If_CutPerformCheck16;
        }
        else {
          pcVar10 = (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0;
        }
        Pars.fCutMin = 1;
        Pars.pFuncCell = pcVar10;
      }
      if (Pars.fUse34Spec == 0) {
        if (Pars.fDeriveLuts != 0 || Pars.fCutMin != 0) goto LAB_00251987;
      }
      else {
        Pars.fCutMin = 1;
        Pars.nLutSize = 4;
LAB_00251987:
        Pars.fExpRed = 0;
        Pars.fTruth = 1;
        if ((Pars.pLutStruct == (char *)0x0) && (Pars.fUseDsdTune == 0)) {
          Pars.fDeriveLuts = 1;
        }
      }
      if (Pars.fUserRecLib != 0) {
        Pars.fTruth = 1;
        Pars.fUsePerm = 1;
        Pars.fCutMin = 1;
        Pars.fExpRed = 0;
        Pars.pLutLib = (If_LibLut_t *)0x0;
      }
      if ((Pars.fDelayOpt != 0 || Pars.fDsdBalance != 0) || Pars.fDelayOptLut != 0) {
        Pars.fCutMin = 1;
        Pars.fTruth = 1;
        Pars.fExpRed = 0;
        Pars.fUseDsd = (int)(Pars.fDsdBalance != 0 || Pars.fDelayOptLut != 0);
        Pars.pLutLib = (If_LibLut_t *)0x0;
      }
      if (0 < Pars.nGateSize) {
        Pars.fTruth = 1;
        Pars.fUsePerm = 1;
        Pars.fCutMin = 1;
        Pars.fExpRed = 0;
        Pars.pLutLib = (If_LibLut_t *)0x0;
        Pars.nLutSize = Pars.nGateSize;
      }
      if (((Pars.fUseDsd != 0) || (Pars.fUseTtPerm != 0)) || (Pars.fLut6Filter != 0)) {
        Pars.fExpRed = 0;
        Pars.fCutMin = 1;
        Pars.fTruth = 1;
        if (Pars.fUseDsd != 0) {
          uVar3 = 0;
          if ((Pars.pLutStruct != (char *)0x0) && (uVar3 = 0, Pars.pLutStruct[2] == '\0')) {
            uVar3 = (int)*Pars.pLutStruct - 0x30;
          }
          pIVar7 = (If_DsdMan_t *)Abc_FrameReadManDsd();
          iVar5 = Pars.nLutSize;
          if ((Pars.pLutStruct != (char *)0x0) && (Pars.pLutStruct[2] != '\0')) {
            pcVar12 = "DSD only works for LUT structures XY.";
            goto LAB_00251c3e;
          }
          if (pIVar7 == (If_DsdMan_t *)0x0) {
            if ((0xc < (int)uVar3) || (0xc < Pars.nLutSize)) {
              printf("Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n"
                     ,(ulong)uVar3,0xc);
              return 0;
            }
            pIVar7 = If_DsdManAlloc(Pars.nLutSize,uVar3);
            Abc_FrameSetManDsd(pIVar7);
          }
          else {
            iVar1 = If_DsdManVarNum(pIVar7);
            if (iVar1 < iVar5) {
              pcVar12 = "DSD manager has incompatible number of variables.";
              goto LAB_00251c3e;
            }
            uVar4 = If_DsdManLutSize(pIVar7);
            if ((uVar3 != uVar4) && (Pars.fDsdBalance == 0)) {
              pcVar12 = "DSD manager has different LUT size.";
              goto LAB_00251c3e;
            }
          }
        }
      }
      iVar5 = Pars.nLutSize;
      if (Pars.fUserRecLib != 0) {
        iVar5 = Abc_NtkRecIsRunning3();
        if (iVar5 == 0) {
          pcVar12 = "LMS manager is not running (use \"rec_start3\").";
LAB_00251c3e:
          puts(pcVar12);
          return 0;
        }
        iVar5 = Abc_NtkRecInputNum3();
        if (iVar5 != Pars.nLutSize) {
          uVar3 = Abc_NtkRecInputNum3();
          printf("The number of library inputs (%d) different from the K parameters (%d).\n",
                 (ulong)uVar3,(ulong)(uint)Pars.nLutSize);
          return 0;
        }
      }
      if ((Pars.fTruth != 0) && (0xf < iVar5)) {
        pcVar12 = "Truth tables cannot be computed for LUT larger than %d inputs.\n";
        uStack_330 = 0xf;
LAB_002516f5:
        Abc_Print(-1,pcVar12,uStack_330);
        return 1;
      }
      pGVar8 = pAbc->pGia;
      if ((pGVar8->pManTime == (void *)0x0) || (pAbc->pLibBox != (void *)0x0)) {
        if (Pars.pLutLib != (If_LibLut_t *)0x0 && 0.0 < Pars.WireDelay) {
          lVar13 = 1;
          iVar5 = (Pars.pLutLib)->LutMax;
          pafVar9 = (Pars.pLutLib)->pLutDelays;
          for (lVar14 = 0; lVar14 <= iVar5; lVar14 = lVar14 + 1) {
            for (lVar15 = 0; lVar13 != lVar15; lVar15 = lVar15 + 1) {
              (*pafVar9)[lVar15] = Pars.WireDelay + (*pafVar9)[lVar15];
            }
            lVar13 = lVar13 + 1;
            pafVar9 = pafVar9 + 1;
          }
        }
        pGVar8 = Gia_ManPerformMapping(pGVar8,&Pars);
        if (Pars.pLutLib != (If_LibLut_t *)0x0 && 0.0 < Pars.WireDelay) {
          iVar5 = (Pars.pLutLib)->LutMax;
          pafVar9 = (Pars.pLutLib)->pLutDelays;
          lVar13 = 1;
          for (lVar14 = 0; lVar14 <= iVar5; lVar14 = lVar14 + 1) {
            for (lVar15 = 0; lVar13 != lVar15; lVar15 = lVar15 + 1) {
              (*pafVar9)[lVar15] = (*pafVar9)[lVar15] - Pars.WireDelay;
            }
            lVar13 = lVar13 + 1;
            pafVar9 = pafVar9 + 1;
          }
        }
        if (pGVar8 != (Gia_Man_t *)0x0) {
          Abc_FrameUpdateGia(pAbc,pGVar8);
          return 0;
        }
        pcVar12 = "Abc_CommandAbc9If(): Mapping of GIA has failed.\n";
      }
      else {
        pcVar12 = "Design has boxes but box library is not entered.\n";
      }
LAB_002516ba:
      iVar5 = -1;
LAB_002516bc:
      Abc_Print(iVar5,pcVar12);
      return iVar11;
    }
    goto switchD_00250ce5_caseD_42;
  }
  Abc_Print(-1,pcVar12);
  goto switchD_00250ce5_caseD_42;
}

Assistant:

int Abc_CommandAbc9If( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    char LutSize[200];
    Gia_Man_t * pNew;
    If_Par_t Pars, * pPars = &Pars;
    int c;
    // set defaults
    Gia_ManSetIfParsDefault( pPars );
    if ( pAbc->pLibLut == NULL )
    {
        Abc_Print( -1, "LUT library is not given. Using default LUT library.\n" );
        pAbc->pLibLut = If_LibLutSetSimple( 6 );
    }
    pPars->pLutLib = (If_LibLut_t *)pAbc->pLibLut;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAGRDEWSTXYqalepmrsdbgxyofuijkztncvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            // if the LUT size is specified, disable library
            pPars->pLutLib = NULL;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaIters < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nGateSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGateSize < 2 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nStructType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStructType < 0 || pPars->nStructType > 2 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndArea < 0 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndArea = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndDelay < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->Epsilon = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Epsilon < 0.0 || pPars->Epsilon > 1.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->WireDelay = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->WireDelay < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pLutStruct = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( strlen(pPars->pLutStruct) != 2 && strlen(pPars->pLutStruct) != 3 )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                goto usage;
            }
            break;
        case 'q':
            pPars->fPreprocess ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'r':
            pPars->fExpRed ^= 1;
            break;
        case 'l':
            pPars->fLut6Filter ^= 1;
            break;
        case 'e':
            pPars->fEdge ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 's':
            pPars->fDelayOptLut ^= 1;
            break;
        case 'd':
            pPars->fUse34Spec ^= 1;
            break;
        case 'b':
            pPars->fUseBat ^= 1;
            break;
        case 'g':
            pPars->fDelayOpt ^= 1;
            break;
        case 'x':
            pPars->fDsdBalance ^= 1;
            break;
        case 'y':
            pPars->fUserRecLib ^= 1;
            break;
        case 'o':
            pPars->fUseBuffs ^= 1;
            break;
        case 'f':
            pPars->fEnableCheck75 ^= 1;
            break;
        case 'u':
            pPars->fEnableCheck75u ^= 1;
            break;
        case 'i':
            pPars->fUseCofVars ^= 1;
            break;
//        case 'j':
//            pPars->fEnableCheck07 ^= 1;
//            break;
        case 'j':
            pPars->fUseAndVars ^= 1;
            break;
        case 'k':
            pPars->fUseDsdTune ^= 1;
            break;
        case 'z':
            pPars->fDeriveLuts ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'n':
            pPars->fUseDsd ^= 1;
            break;
        case 'c':
            pPars->fUseTtPerm ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVerboseTrace ^= 1;
            break;
        case 'h':
            pPars->fHashMapping ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        if ( !Abc_FrameReadFlag("silentmode") )
        Abc_Print( -1, "Empty GIA network.\n" );
        return 0;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has mapping. Run \"&st\".\n" );
        return 1;
    }

    if ( pPars->nLutSize == -1 )
    {
        if ( pPars->pLutLib == NULL )
        {
            Abc_Print( -1, "The LUT library is not given.\n" );
            return 1;
        }
        // get LUT size from the library
        pPars->nLutSize = pPars->pLutLib->LutMax;
        // if variable pin delay, force truth table computation
//        if ( pPars->pLutLib->fVarPinDelays )
//            pPars->fTruth = 1;
    }

    if ( pPars->nLutSize < 2 || pPars->nLutSize > IF_MAX_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", pPars->nLutSize );
        return 1;
    }

    if ( pPars->nCutsMax < 1 || pPars->nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    // enable truth table computation if choices are selected
    if ( Gia_ManHasChoices(pAbc->pGia) )
    {
//        if ( !Abc_FrameReadFlag("silentmode") )
//            Abc_Print( 0, "Performing LUT mapping with choices.\n" );
        pPars->fExpRed = 0;
    }

    if ( pPars->fUseBat )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature only works for {4,5,6}-LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }

    if ( pPars->fEnableCheck07 + pPars->fUseCofVars + pPars->fUseDsdTune + pPars->fEnableCheck75 + pPars->fEnableCheck75u + (pPars->pLutStruct != NULL) > 1 )
    {
        Abc_Print( -1, "Only one additional check can be performed at the same time.\n" );
        return 1;
    }
    if ( pPars->fEnableCheck07 )
    {
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 7 )
        {
            Abc_Print( -1, "This feature only works for {6,7}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck07;
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseCofVars )
    {
        if ( !(pPars->nLutSize & 1) )
        {
            Abc_Print( -1, "This feature only works for odd-sized LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseAndVars )
        pPars->fCutMin = 1;
    if ( pPars->fUseDsdTune )
    {
        If_DsdMan_t * pDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pDsdMan == NULL )
        {
            Abc_Print( -1, "DSD manager is not available.\n" );
            return 1;
        }
        if ( pPars->nLutSize > If_DsdManVarNum(pDsdMan) )
        {
            Abc_Print( -1, "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n", pPars->nLutSize, If_DsdManVarNum(pDsdMan) );
            return 1;
        }
        if ( pPars->fDeriveLuts && If_DsdManGetCellStr(pDsdMan) == NULL )
        {
            Abc_Print( -1, "DSD manager is not matched with any particular cell.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
        pPars->fUseDsd = 1;
        If_DsdManSetNewAsUseless( pDsdMan );
    }
    if ( pPars->fEnableCheck75 || pPars->fEnableCheck75u )
    {
        if ( pPars->fEnableCheck75 && pPars->fEnableCheck75u )
        {
            Abc_Print( -1, "Switches -f and -u are not compatible.\n" );
            return 1;
        }
        if ( pPars->nLutSize < 5 || pPars->nLutSize > 8 )
        {
            Abc_Print( -1, "This feature only works for {6,7,8}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck75;
        pPars->fCutMin = 1;
    }
    if ( pPars->pLutStruct )
    {
        if ( pPars->fDsdBalance )
        {
            Abc_Print( -1, "Incompatible options (-S and -x).\n" );
            return 1;
        }
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 16 )
        {
            Abc_Print( -1, "This feature only works for [6;16]-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = pPars->fDelayOptLut ? NULL : If_CutPerformCheck16;
        pPars->fCutMin = 1;
    }

    if ( pPars->fUse34Spec )
    {
        pPars->fTruth    = 1;
        pPars->fCutMin   = 1;
        pPars->nLutSize  = 4;
    }

    // enable truth table computation if cut minimization is selected
    if ( pPars->fCutMin || pPars->fDeriveLuts )
    {
        pPars->fTruth = 1;
        pPars->fExpRed = 0;
        if ( pPars->pLutStruct == NULL && !pPars->fUseDsdTune )
            pPars->fDeriveLuts = 1;
    }
    // modify the subgraph recording
    if ( pPars->fUserRecLib )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fDelayOptLut )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUseDsd     =  pPars->fDsdBalance || pPars->fDelayOptLut;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->nGateSize > 0 )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
        pPars->nLutSize    =  pPars->nGateSize;
    }

    if ( pPars->fUseDsd || pPars->fUseTtPerm || pPars->fLut6Filter )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
    }

    if ( pPars->fUseDsd )
    {
        int LutSize = (pPars->pLutStruct && pPars->pLutStruct[2] == 0)? pPars->pLutStruct[0] - '0' : 0;
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->pLutStruct && pPars->pLutStruct[2] != 0 )
        {
            printf( "DSD only works for LUT structures XY.\n" );
            return 0;
        }
        if ( p && pPars->nLutSize > If_DsdManVarNum(p) )
        {
            printf( "DSD manager has incompatible number of variables.\n" );
            return 0;
        }
        if ( p && LutSize != If_DsdManLutSize(p) && !pPars->fDsdBalance )
        {
            printf( "DSD manager has different LUT size.\n" );
            return 0;
        }
        if ( p == NULL )
        {
            if ( LutSize > DAU_MAX_VAR || pPars->nLutSize > DAU_MAX_VAR )
            {
                printf( "Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n", LutSize, DAU_MAX_VAR );
                return 0;
            }
            Abc_FrameSetManDsd( If_DsdManAlloc(pPars->nLutSize, LutSize) );
        }
    }

    if ( pPars->fUserRecLib )
    {
        if ( !Abc_NtkRecIsRunning3() )
        {
            printf( "LMS manager is not running (use \"rec_start3\").\n" );
            return 0;
        }
        if ( Abc_NtkRecInputNum3() != pPars->nLutSize )
        {
            printf( "The number of library inputs (%d) different from the K parameters (%d).\n", Abc_NtkRecInputNum3(), pPars->nLutSize );
            return 0;
        }
    }

    // complain if truth tables are requested but the cut size is too large
    if ( pPars->fTruth && pPars->nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Truth tables cannot be computed for LUT larger than %d inputs.\n", IF_MAX_FUNC_LUTSIZE );
        return 1;
    }
    if ( pAbc->pGia->pManTime && pAbc->pLibBox == NULL )
    {
        Abc_Print( -1, "Design has boxes but box library is not entered.\n" );
        return 1;
    }

    // add wire delay to LUT library delays
    if ( pPars->WireDelay > 0 && pPars->pLutLib )
    {
        int i, k;
        for ( i = 0; i <= pPars->pLutLib->LutMax; i++ )
            for ( k = 0; k <= i; k++ )
                pPars->pLutLib->pLutDelays[i][k] += pPars->WireDelay;
    }
    // perform mapping
    pNew = Gia_ManPerformMapping( pAbc->pGia, pPars );
    // subtract wire delay from LUT library delays
    if ( pPars->WireDelay > 0 && pPars->pLutLib )
    {
        int i, k;
        for ( i = 0; i <= pPars->pLutLib->LutMax; i++ )
            for ( k = 0; k <= i; k++ )
                pPars->pLutLib->pLutDelays[i][k] -= pPars->WireDelay;
    }
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9If(): Mapping of GIA has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%.2f", pPars->DelayTarget );
    if ( pPars->nLutSize == -1 )
        sprintf(LutSize, "library" );
    else
        sprintf(LutSize, "%d", pPars->nLutSize );
    Abc_Print( -2, "usage: &if [-KCFAGRTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyofuijkztnchvw]\n" );
    Abc_Print( -2, "\t           performs FPGA technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n", IF_MAX_LUTSIZE+1, LutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n", pPars->nFlowIters );
    Abc_Print( -2, "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n", pPars->nAreaIters );
    Abc_Print( -2, "\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n", pPars->nGateSize );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-T num   : the type of LUT structures [default = any]\n", pPars->nStructType );
    Abc_Print( -2, "\t-X num   : delay of AND-gate in LUT library units [default = %d]\n", pPars->nAndDelay );
    Abc_Print( -2, "\t-Y num   : area of AND-gate in LUT library units [default = %d]\n", pPars->nAndArea );
    Abc_Print( -2, "\t-D float : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-E float : sets epsilon used for tie-breaking [default = %f]\n", pPars->Epsilon );
    Abc_Print( -2, "\t-W float : sets wire delay between adjects LUTs [default = %f]\n", pPars->WireDelay );
    Abc_Print( -2, "\t-S str   : string representing the LUT structure [default = %s]\n", pPars->pLutStruct ? pPars->pLutStruct : "not used" );
    Abc_Print( -2, "\t-q       : toggles preprocessing using several starting points [default = %s]\n", pPars->fPreprocess? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fArea? "yes": "no" );
    Abc_Print( -2, "\t-r       : enables expansion/reduction of the best cuts [default = %s]\n", pPars->fExpRed? "yes": "no" );
//    Abc_Print( -2, "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n", pPars->fLatchPaths? "yes": "no" );
    Abc_Print( -2, "\t-l       : toggle restricting the type of 6-input lookup tables [default = %s]\n", pPars->fLut6Filter? "yes": "no" );
    Abc_Print( -2, "\t-e       : uses edge-based cut selection heuristics [default = %s]\n", pPars->fEdge? "yes": "no" );
    Abc_Print( -2, "\t-p       : uses power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n", pPars->fDelayOptLut? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles deriving specialized matching step [default = %s]\n", pPars->fUse34Spec? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggles the use of one special feature [default = %s]\n", pPars->fUseBat? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles delay optimization by SOP balancing [default = %s]\n", pPars->fDelayOpt? "yes": "no" );
    Abc_Print( -2, "\t-x       : toggles delay optimization by DSD balancing [default = %s]\n", pPars->fDsdBalance? "yes": "no" );
    Abc_Print( -2, "\t-y       : toggles delay optimization with recorded library [default = %s]\n", pPars->fUserRecLib? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n", pPars->fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck75? "yes": "no" );
    Abc_Print( -2, "\t-u       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck75u? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggles using cofactoring variables [default = %s]\n", pPars->fUseCofVars? "yes": "no" );
//    Abc_Print( -2, "\t-j       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck07? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggles using AND bi-decomposition [default = %s]\n", pPars->fUseAndVars? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n", pPars->fUseDsdTune? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggles deriving LUTs when mapping into LUT structures [default = %s]\n", pPars->fDeriveLuts? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-n       : toggles computing DSDs of the cut functions [default = %s]\n", pPars->fUseDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles computing truth tables in a new way [default = %s]\n", pPars->fUseTtPerm? "yes": "no" );
    Abc_Print( -2, "\t-h       : toggles rehashing AIG after mapping [default = %s]\n", pPars->fHashMapping? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles printing delay trace [default = %s]\n", pPars->fVerboseTrace? "yes": "no" );
    return 1;
}